

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

bool QtPrivate::
     q_points_into_range<QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>,QAbstractItemModelTesterPrivate::Changing_const*>
               (Changing **p,QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *c)

{
  undefined8 uVar1;
  bool bVar2;
  Changing *__last;
  Changing *__first;
  difference_type dVar3;
  undefined8 *in_RDI;
  
  uVar1 = *in_RDI;
  __last = std::data<QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>>
                     ((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x196c35);
  __first = std::data<QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>>
                      ((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x196c44);
  std::begin<QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>>
            ((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x196c53);
  std::end<QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>>
            ((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x196c64);
  dVar3 = std::distance<QAbstractItemModelTesterPrivate::Changing_const*>(__first,__last);
  bVar2 = q_points_into_range<QAbstractItemModelTesterPrivate::Changing,std::less<void>>
                    (uVar1,__last,__first + dVar3);
  return bVar2;
}

Assistant:

static constexpr bool q_points_into_range(const T &p, const C &c) noexcept
{
    static_assert(std::is_same_v<decltype(std::data(c)), T>);

    // std::distance because QArrayDataPointer has a "qsizetype size"
    // member but no size() function
    return q_points_into_range(p, std::data(c),
                               std::data(c) + std::distance(std::begin(c), std::end(c)));
}